

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

Type Internal_FigureTypeFromHashedFontName(InternalHashToName *key)

{
  int iVar1;
  void *pvVar2;
  size_t sizeof_e;
  InternalHashToName *e;
  InternalHashToName *key_local;
  
  if (Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::single_stroke_name_map ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::
                                 single_stroke_name_map);
    if (iVar1 != 0) {
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map,
                 L"Machine Tool Gothic");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 1,
                 L"MachineToolGothic");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 2,
                 L"Machine Tool Grenadier");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 3,
                 L"MachineToolGrenadier");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 4,
                 L"Machine Tool Handscript");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 5,
                 L"MachineToolHandscript");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 6,
                 L"Machine Tool SanSerif");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 7,
                 L"MachineToolSanSerif");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 8,
                 L"Machine Tool Script");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 9,
                 L"MachineToolScript");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 10,
                 L"MecSoft_Font-1");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0xb,
                 L"MecSoft_Font-1");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0xc,
                 L"OrachTech1Lotf");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0xd,
                 L"OrachTech1Lotf");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0xe,
                 L"OrachTechDemo1Lotf");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0xf,
                 L"OrachTechDemo1Lotf");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x10,
                 L"OrachTech1Lttf");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x11,
                 L"OrachTech1Lttf");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x12,
                 L"OrachTechDemo1Lttf");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x13,
                 L"OrachTechDemo1Lttf");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x14,L"RHSS");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x15,L"RhSS-Normal"
                );
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x16,L"SDstroke");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x17,
                 L"SDstroke-latin");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x18,
                 L"SLF-RHN Architect");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x19,
                 L"SLF-RHN-Architect");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x1a,
                 L"SLF-RHN Industrial");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x1b,
                 L"SLF-RHN-Industrial");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x1c,
                 L"SLF-RHN White Linen");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x1d,
                 L"SLF-RHN-WhiteLiinen");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x1e,
                 L"AVGauge Engraving");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::single_stroke_name_map + 0x1f,
                 L"AVGauge_Engraving");
      __cxa_guard_release(&Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::
                           single_stroke_name_map);
    }
  }
  if (Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::double_stroke_name_map ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::
                                 double_stroke_name_map);
    if (iVar1 != 0) {
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map,L"1CamBam_Stick_1");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 1,
                 L"1CamBamStick1-normal");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 2,
                 L"1CamBam_Stick_2");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 3,
                 L"1CamBamStick2-normal");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 4,
                 L"1CamBam_Stick_3");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 5,
                 L"1CamBamStick3-normal");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 6,
                 L"1CamBam_Stick_4");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 7,
                 L"1CamBamStick4-normal");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 8,
                 L"1CamBam_Stick_5");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 9,
                 L"1CamBamStick5-normal");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 10,
                 L"1CamBam_Stick_6");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 0xb,
                 L"1CamBamStick6-normal");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 0xc,
                 L"1CamBam_Stick_7");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 0xd,
                 L"1CamBamStick7-normal");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 0xe,
                 L"1CamBam_Stick_8");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 0xf,
                 L"1CamBamStick8-normal");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 0x10,
                 L"1CamBam_Stick_9");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 0x11,
                 L"1CamBamStick9");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 0x12,L"CNC Vector")
      ;
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 0x13,L"CNCVector");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 0x14,
                 L"CNC Vector Mirror");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::double_stroke_name_map + 0x15,
                 L"CNCVectorMirror");
      __cxa_guard_release(&Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::
                           double_stroke_name_map);
    }
  }
  if (Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::perimeter_name_map == '\0')
  {
    iVar1 = __cxa_guard_acquire(&Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::
                                 perimeter_name_map);
    if (iVar1 != 0) {
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map,L"Arial");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 1,L"Bahnschrift");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 2,L"CityBlueprint");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 3,L"CountryBlueprint");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 4,L"Courier");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 5,L"Courier New");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 6,L"Franklin Gothic");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 7,L"Helvetica");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 8,L"Helvetica Neue");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 9,L"Segoe UI");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 10,L"Times New Roman");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0xb,L"Tecnnic");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0xc,L"ArialMT");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0xd,L"CourierNewPS");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0xe,L"CourierNewPSMT");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0xf,L"FranklinGothic");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0x10,L"HelveticaNeue");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0x11,L"TimesNewRomanPS"
                );
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0x12,
                 L"TimesNewRomanPSMT");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0x13,L"OrachTech2Lotf")
      ;
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0x14,L"OrachTech2Lotf")
      ;
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0x15,
                 L"OrachTechDemo2Lotf");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0x16,
                 L"OrachTechDemo2Lotf");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0x17,L"OrachTech2Lttf")
      ;
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0x18,L"OrachTech2Lttf")
      ;
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0x19,
                 L"OrachTechDemo2Lttf");
      InternalHashToName::InternalHashToName
                (Internal_FigureTypeFromHashedFontName::perimeter_name_map + 0x1a,
                 L"OrachTechDemo2Lttf");
      __cxa_guard_release(&Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::
                           perimeter_name_map);
    }
  }
  if (key == (InternalHashToName *)0x0) {
    key_local._7_1_ = Unknown;
  }
  else {
    if (Internal_FigureTypeFromHashedFontName::single_stroke_name_map_count == 0) {
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map_count =
           InternalHashToName::SortAndCullByHash
                     (Internal_FigureTypeFromHashedFontName::single_stroke_name_map,0x20);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map_count =
           InternalHashToName::SortAndCullByHash
                     (Internal_FigureTypeFromHashedFontName::double_stroke_name_map,0x16);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map_count =
           InternalHashToName::SortAndCullByHash
                     (Internal_FigureTypeFromHashedFontName::perimeter_name_map,0x1b);
    }
    pvVar2 = bsearch(key,Internal_FigureTypeFromHashedFontName::single_stroke_name_map,
                     Internal_FigureTypeFromHashedFontName::single_stroke_name_map_count,0x20,
                     InternalHashToName::CompareHash);
    if (pvVar2 == (void *)0x0) {
      pvVar2 = bsearch(key,Internal_FigureTypeFromHashedFontName::double_stroke_name_map,
                       Internal_FigureTypeFromHashedFontName::double_stroke_name_map_count,0x20,
                       InternalHashToName::CompareHash);
      if (pvVar2 == (void *)0x0) {
        pvVar2 = bsearch(key,Internal_FigureTypeFromHashedFontName::perimeter_name_map,
                         Internal_FigureTypeFromHashedFontName::perimeter_name_map_count,0x20,
                         InternalHashToName::CompareHash);
        if (pvVar2 == (void *)0x0) {
          key_local._7_1_ = Unset;
        }
        else {
          key_local._7_1_ = Perimeter;
        }
      }
      else {
        key_local._7_1_ = DoubleStroke;
      }
    }
    else {
      key_local._7_1_ = SingleStroke;
    }
  }
  return key_local._7_1_;
}

Assistant:

static ON_OutlineFigure::Type Internal_FigureTypeFromHashedFontName(
  const InternalHashToName* key
)
{
  static InternalHashToName single_stroke_name_map[] = 
  {
    // Known single stroke fonts names
                                                   
    // Machine Tool
    InternalHashToName(L"Machine Tool Gothic"), // Family
    InternalHashToName(L"MachineToolGothic"), // PostScript
    InternalHashToName(L"Machine Tool Grenadier"), // Family
    InternalHashToName(L"MachineToolGrenadier"), // PostScript
    InternalHashToName(L"Machine Tool Handscript"), // Family
    InternalHashToName(L"MachineToolHandscript"), // PostScript
    InternalHashToName(L"Machine Tool SanSerif"), // Family
    InternalHashToName(L"MachineToolSanSerif"), // PostScript
    InternalHashToName(L"Machine Tool Script"), // Family
    InternalHashToName(L"MachineToolScript"), // PostScript

    // MecSoft
    InternalHashToName(L"MecSoft_Font-1"), // Family
    InternalHashToName(L"MecSoft_Font-1"), // PostScript

    // Orach Technic 1L
    InternalHashToName(L"OrachTech1Lotf"), // Family
    InternalHashToName(L"OrachTech1Lotf"), // PostScript
    InternalHashToName(L"OrachTechDemo1Lotf"), // Family
    InternalHashToName(L"OrachTechDemo1Lotf"), // PostScript
    InternalHashToName(L"OrachTech1Lttf"), // Family
    InternalHashToName(L"OrachTech1Lttf"), // PostScript
    InternalHashToName(L"OrachTechDemo1Lttf"), // Family
    InternalHashToName(L"OrachTechDemo1Lttf"), // PostScript

    // Rhino Single Stroke by Lowell Walmsley 
    InternalHashToName(L"RHSS"), // Family
    InternalHashToName(L"RhSS-Normal"), // PostScript

    // SD Stroke Open Type Font
    InternalHashToName(L"SDstroke"), // Family
    InternalHashToName(L"SDstroke-latin"), // PostScript


    // Single line fonts
    // Included here for now until 
    // https://mcneel.myjetbrains.com/youtrack/issue/RH-57328
    // Gets fonts with the field 10 description set.
    InternalHashToName(L"SLF-RHN Architect"), // Family
    InternalHashToName(L"SLF-RHN-Architect"), // PostScript

    InternalHashToName(L"SLF-RHN Industrial"), // Family
    InternalHashToName(L"SLF-RHN-Industrial"), // PostScript

    InternalHashToName(L"SLF-RHN White Linen"), // Family
    InternalHashToName(L"SLF-RHN-WhiteLiinen"), // PostScript

    // https://mcneel.myjetbrains.com/youtrack/issue/RH-67652
    InternalHashToName(L"AVGauge Engraving"), // Family
    InternalHashToName(L"AVGauge_Engraving"), // PostScript
  };

  static InternalHashToName double_stroke_name_map[] = 
  {
    // Known double stroke fonts names
    //  If a double stroke font is treated as a single stroke font,
    //  then the "TrueType" automatic closure segment is dropped
    //  and glyphs for code points like o O 8 Q, ... have missing segments.
   
    // CamBam Stick fonts
    InternalHashToName(L"1CamBam_Stick_1"), // Family
    InternalHashToName(L"1CamBamStick1-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_2"), // Family
    InternalHashToName(L"1CamBamStick2-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_3"), // Family
    InternalHashToName(L"1CamBamStick3-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_4"), // Family
    InternalHashToName(L"1CamBamStick4-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_5"), // Family
    InternalHashToName(L"1CamBamStick5-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_6"), // Family
    InternalHashToName(L"1CamBamStick6-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_7"), // Family
    InternalHashToName(L"1CamBamStick7-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_8"), // Family
    InternalHashToName(L"1CamBamStick8-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_9"), // Family
    InternalHashToName(L"1CamBamStick9"), // PostScript

    // CNC Vector
    InternalHashToName(L"CNC Vector"), // Family
    InternalHashToName(L"CNCVector"), // PostScript
    InternalHashToName(L"CNC Vector Mirror"), // Family
    InternalHashToName(L"CNCVectorMirror"), // PostScript

    // NOTE WELL: 
    //  Orach Technic 2L fonts are NOT a double stroke fonts.
    //  The figure outlines are simple closed perimenters
    //  that contain postive areas. 
    //  The behave poorly in simulated bold face.
  };

  static InternalHashToName perimeter_name_map[] = 
  {
    // Known perimeter stroke fonts names
    //  In fact, almost every TrueType, PostScript, and OpenType font
    //  has periemter figures. The list below contains fonts
    //  that some people might think are single or double stroke
    //  and common fonts so we don't keep checking.

    // Common
    InternalHashToName(L"Arial"),
    InternalHashToName(L"Bahnschrift"),
    InternalHashToName(L"CityBlueprint"),
    InternalHashToName(L"CountryBlueprint"),
    InternalHashToName(L"Courier"),
    InternalHashToName(L"Courier New"),
    InternalHashToName(L"Franklin Gothic"),
    InternalHashToName(L"Helvetica"),
    InternalHashToName(L"Helvetica Neue"),
    InternalHashToName(L"Segoe UI"),
    InternalHashToName(L"Times New Roman"),
    InternalHashToName(L"Tecnnic"),
    InternalHashToName(L"ArialMT"),
    InternalHashToName(L"CourierNewPS"),
    InternalHashToName(L"CourierNewPSMT"),
    InternalHashToName(L"FranklinGothic"),
    InternalHashToName(L"HelveticaNeue"),
    InternalHashToName(L"TimesNewRomanPS"),
    InternalHashToName(L"TimesNewRomanPSMT"),
   
    // Orach Technic 1L
    InternalHashToName(L"OrachTech2Lotf"), // Family
    InternalHashToName(L"OrachTech2Lotf"), // PostScript
    InternalHashToName(L"OrachTechDemo2Lotf"), // Family
    InternalHashToName(L"OrachTechDemo2Lotf"), // PostScript
    InternalHashToName(L"OrachTech2Lttf"), // Family
    InternalHashToName(L"OrachTech2Lttf"), // PostScript
    InternalHashToName(L"OrachTechDemo2Lttf"), // Family
    InternalHashToName(L"OrachTechDemo2Lttf"), // PostScript
  };

  static size_t single_stroke_name_map_count = 0;
  static size_t double_stroke_name_map_count = 0;
  static size_t perimeter_name_map_count = 0;

  if ( nullptr == key)
    return ON_OutlineFigure::Type::Unknown;

  const InternalHashToName* e;
  const size_t sizeof_e = sizeof(*e);

  if (0 == single_stroke_name_map_count)
  {
    single_stroke_name_map_count = InternalHashToName::SortAndCullByHash(single_stroke_name_map, (sizeof(single_stroke_name_map) / sizeof_e));
    double_stroke_name_map_count = InternalHashToName::SortAndCullByHash(double_stroke_name_map, (sizeof(double_stroke_name_map) / sizeof_e));
    perimeter_name_map_count = InternalHashToName::SortAndCullByHash(perimeter_name_map, (sizeof(perimeter_name_map) / sizeof_e));
  }


  e = (const InternalHashToName*)bsearch(key, single_stroke_name_map, single_stroke_name_map_count, sizeof_e, InternalHashToName::CompareHash);
  if (nullptr != e)
    return ON_OutlineFigure::Type::SingleStroke;

  e = (const InternalHashToName*)bsearch(key, double_stroke_name_map, double_stroke_name_map_count, sizeof_e, InternalHashToName::CompareHash);
  if (nullptr != e)
    return ON_OutlineFigure::Type::DoubleStroke;

  e = (const InternalHashToName*)bsearch(key, perimeter_name_map, perimeter_name_map_count, sizeof_e, InternalHashToName::CompareHash);
  if (nullptr != e)
    return ON_OutlineFigure::Type::Perimeter;

  // return Unset instead of Unknown in this internal tool
  return ON_OutlineFigure::Type::Unset;
}